

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_decompress_fast_usingDict
              (char *source,char *dest,int originalSize,char *dictStart,int dictSize)

{
  int iVar1;
  size_t prefixSize;
  
  if (dictSize == 0) {
    prefixSize = 0;
  }
  else {
    prefixSize = (size_t)dictSize;
    if (dictStart + prefixSize != dest) {
      iVar1 = LZ4_decompress_unsafe_generic
                        ((BYTE *)source,(BYTE *)dest,originalSize,0,(BYTE *)dictStart,prefixSize);
      return iVar1;
    }
  }
  iVar1 = LZ4_decompress_unsafe_generic
                    ((BYTE *)source,(BYTE *)dest,originalSize,prefixSize,(BYTE *)0x0,0);
  return iVar1;
}

Assistant:

int LZ4_decompress_fast_usingDict(const char* source, char* dest, int originalSize, const char* dictStart, int dictSize)
{
    if (dictSize==0 || dictStart+dictSize == dest)
        return LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        (size_t)dictSize, NULL, 0);
    assert(dictSize >= 0);
    return LZ4_decompress_fast_extDict(source, dest, originalSize, dictStart, (size_t)dictSize);
}